

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_node_grp * lysp_node_groupings(lysp_node *node)

{
  uint16_t uVar1;
  lysp_node *node_local;
  
  uVar1 = node->nodetype;
  if (uVar1 == 1) {
    node_local = (lysp_node *)node[1].dsc;
  }
  else if (uVar1 == 0x10) {
    node_local = (lysp_node *)node[1].dsc;
  }
  else if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
    node_local = *(lysp_node **)&node[1].nodetype;
  }
  else if (uVar1 == 0x400) {
    node_local = node[1].next;
  }
  else if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
    node_local = node[1].next;
  }
  else if (uVar1 == 0x4000) {
    node_local = *(lysp_node **)&node[1].nodetype;
  }
  else {
    node_local = (lysp_node *)0x0;
  }
  return (lysp_node_grp *)node_local;
}

Assistant:

lysp_node_grp *
lysp_node_groupings(const struct lysp_node *node)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
        return ((struct lysp_node_container *)node)->groupings;
    case LYS_LIST:
        return ((struct lysp_node_list *)node)->groupings;
    case LYS_GROUPING:
        return ((struct lysp_node_grp *)node)->groupings;
    case LYS_RPC:
    case LYS_ACTION:
        return ((struct lysp_node_action *)node)->groupings;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return ((struct lysp_node_action_inout *)node)->groupings;
    case LYS_NOTIF:
        return ((struct lysp_node_notif *)node)->groupings;
    default:
        return NULL;
    }
}